

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

float __thiscall embree::Token::Float(Token *this,bool cast)

{
  runtime_error *this_00;
  float fVar1;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->ty == TY_INT) {
    if (!cast) goto LAB_0017e62d;
    fVar1 = (float)(this->field_1).i;
  }
  else {
    if (this->ty != TY_FLOAT) {
LAB_0017e62d:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(&sStack_58,&this->loc);
      std::operator+(&local_38,&sStack_58,": float expected");
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar1 = (float)(this->field_1).i;
  }
  return fVar1;
}

Assistant:

float Float(bool cast = true)  const {
      if (ty == TY_FLOAT) return f;
      if (ty == TY_INT && cast) return (float)i;
      THROW_RUNTIME_ERROR(loc.str()+": float expected");
    }